

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pool.cpp
# Opt level: O0

bool __thiscall xmrig::Pool::isEqual(Pool *this,Pool *other)

{
  bool bVar1;
  int *in_RSI;
  Url *in_RDI;
  Url *in_stack_ffffffffffffffd8;
  bool local_11;
  
  bVar1 = std::bitset<2UL>::operator==
                    ((bitset<2UL> *)in_RDI,(bitset<2UL> *)in_stack_ffffffffffffffd8);
  local_11 = false;
  if (((bVar1) && (local_11 = false, *(int *)in_RDI == *in_RSI)) &&
     (local_11 = false, in_RDI->m_scheme == in_RSI[1])) {
    bVar1 = String::operator==((String *)in_RDI,(String *)in_stack_ffffffffffffffd8);
    local_11 = false;
    if (bVar1) {
      bVar1 = String::operator==((String *)in_RDI,(String *)in_stack_ffffffffffffffd8);
      local_11 = false;
      if (bVar1) {
        bVar1 = String::operator==((String *)in_RDI,(String *)in_stack_ffffffffffffffd8);
        local_11 = false;
        if (bVar1) {
          bVar1 = Url::operator==(in_RDI,in_stack_ffffffffffffffd8);
          local_11 = false;
          if (bVar1) {
            bVar1 = String::operator==((String *)in_RDI,(String *)in_stack_ffffffffffffffd8);
            local_11 = false;
            if ((bVar1) && (local_11 = false, in_RDI[1].m_url.m_size == *(size_t *)(in_RSI + 0x14)))
            {
              local_11 = Url::operator==(in_RDI,in_stack_ffffffffffffffd8);
            }
          }
        }
      }
    }
  }
  return local_11;
}

Assistant:

bool xmrig::Pool::isEqual(const Pool &other) const
{
    return (m_flags           == other.m_flags
            && m_keepAlive    == other.m_keepAlive
            && m_mode         == other.m_mode
            && m_fingerprint  == other.m_fingerprint
            && m_password     == other.m_password
            && m_rigId        == other.m_rigId
            && m_url          == other.m_url
            && m_user         == other.m_user
            && m_pollInterval == other.m_pollInterval
            && m_daemon       == other.m_daemon
            );
}